

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O3

void __thiscall FStringTable::FreeNonDehackedStrings(FStringTable *this)

{
  StringEntry *pSVar1;
  StringEntry *block;
  int i;
  long lVar2;
  StringEntry *pSVar3;
  StringEntry *pSVar4;
  
  lVar2 = 0;
  do {
    if (this->Buckets[lVar2] != (StringEntry *)0x0) {
      block = this->Buckets[lVar2];
      pSVar3 = (StringEntry *)(this->Buckets + lVar2);
      do {
        pSVar1 = block->Next;
        pSVar4 = block;
        if (block->PassNum != '\0') {
          pSVar3->Next = pSVar1;
          M_Free(block);
          pSVar4 = pSVar3;
        }
        block = pSVar1;
        pSVar3 = pSVar4;
      } while (pSVar1 != (StringEntry *)0x0);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

void FStringTable::FreeNonDehackedStrings ()
{
	for (int i = 0; i < HASH_SIZE; ++i)
	{
		StringEntry *entry, *next, **pentry;

		for (pentry = &Buckets[i], entry = *pentry; entry != NULL; )
		{
			next = entry->Next;
			if (entry->PassNum != 0)
			{
				*pentry = next;
				M_Free (entry);
			}
			else
			{
				pentry = &entry->Next;
			}
			entry = next;
		}
	}
}